

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O2

void __thiscall BMRS<TTA>::PerformLabeling(BMRS<TTA> *this)

{
  Data_Compressed *this_00;
  undefined8 uVar1;
  ushort uVar2;
  int _height;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Mat1b *pMVar6;
  uint64_t *puVar7;
  uint64_t *puVar8;
  Mat1i *pMVar9;
  int iVar10;
  uint *puVar11;
  ulong uVar12;
  Run *pRVar13;
  int j_3;
  int j_1;
  long lVar14;
  uint64_t *puVar15;
  uint64_t *puVar16;
  int j_4;
  int _height_00;
  int iVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  uint64_t *puVar21;
  int i;
  int j;
  ulong uVar22;
  long lVar23;
  long local_e8;
  int local_9c;
  Size local_98;
  Mat local_90 [96];
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  _height = *(int *)&pMVar6->field_0x8;
  iVar3 = *(int *)&pMVar6->field_0xc;
  this_00 = &this->data_compressed;
  Data_Compressed::Alloc(this_00,_height,iVar3);
  InitCompressedData(this,this_00);
  iVar10 = _height % 2;
  iVar17 = (int)((long)_height / 2);
  _height_00 = iVar10 + iVar17;
  uVar4 = (this->data_compressed).data_width;
  Data_Compressed::Alloc(&this->data_merged,_height_00,iVar3);
  puVar7 = (this->data_compressed).bits;
  puVar8 = (this->data_merged).bits;
  lVar18 = (long)(this->data_compressed).data_width;
  lVar14 = (long)(this->data_merged).data_width;
  uVar19 = 0;
  uVar12 = 0;
  if (0 < (int)uVar4) {
    uVar12 = (ulong)uVar4;
  }
  uVar20 = 0;
  if (0 < iVar17) {
    uVar20 = (long)_height / 2 & 0xffffffff;
  }
  puVar21 = puVar7 + lVar18;
  puVar16 = puVar7;
  puVar15 = puVar8;
  for (; uVar19 != uVar20; uVar19 = uVar19 + 1) {
    for (uVar22 = 0; uVar12 != uVar22; uVar22 = uVar22 + 1) {
      puVar15[uVar22] = puVar21[uVar22] | puVar16[uVar22];
    }
    puVar15 = puVar15 + lVar14;
    puVar21 = puVar21 + lVar18 * 2;
    puVar16 = puVar16 + lVar18 * 2;
  }
  if (iVar10 != 0) {
    for (uVar19 = 0; uVar12 != uVar19; uVar19 = uVar19 + 1) {
      puVar8[lVar14 * iVar17 + uVar19] = puVar7[lVar18 * (_height + -1) + uVar19];
    }
  }
  Data_Compressed::Alloc(&this->data_flags,_height_00 + -1,iVar3);
  uVar5 = (this->data_flags).height;
  puVar7 = (this->data_compressed).bits;
  puVar8 = (this->data_flags).bits;
  lVar14 = (long)(this->data_compressed).data_width;
  uVar19 = 0;
  uVar12 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar12 = uVar19;
  }
  lVar18 = (long)(this->data_flags).data_width;
  puVar21 = puVar7 + lVar14;
  puVar15 = puVar8;
  puVar16 = puVar7;
  for (; puVar16 = puVar16 + lVar14 * 2, uVar19 != uVar12; uVar19 = uVar19 + 1) {
    puVar8[uVar19 * lVar18] =
         (puVar7[(uVar19 * 2 + 2) * lVar14] * 2 | puVar7[(uVar19 * 2 + 2) * lVar14]) &
         (puVar7[(uVar19 * 2 + 1) * lVar14] * 2 | puVar7[(uVar19 * 2 + 1) * lVar14]);
    for (lVar23 = 1; lVar23 < (int)uVar4; lVar23 = lVar23 + 1) {
      puVar15[lVar23] =
           (puVar16[lVar23 + -1] >> 0x3f | puVar16[lVar23] << 1 | puVar16[lVar23]) &
           (puVar21[lVar23 + -1] >> 0x3f | puVar21[lVar23] << 1 | puVar21[lVar23]);
    }
    puVar21 = puVar21 + lVar14 * 2;
    puVar15 = puVar15 + lVar18;
  }
  Runs::Alloc(&this->data_runs,_height_00,iVar3);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  FindRuns(this,(this->data_merged).bits,(this->data_flags).bits,_height_00,uVar4,
           (this->data_runs).runs);
  uVar1 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_98.height = (int)uVar1;
  local_98.width = (int)((ulong)uVar1 >> 0x20);
  local_9c = 0;
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98,&local_9c);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pRVar13 = (this->data_runs).runs;
  pMVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  puVar7 = (this->data_compressed).bits;
  lVar14 = 1;
  local_e8 = 0;
  for (uVar12 = 0; puVar11 = TTA::rtable_, uVar12 != uVar20; uVar12 = uVar12 + 1) {
    iVar3 = (this->data_compressed).data_width;
    iVar17 = (int)uVar12 * iVar3;
    lVar18 = *(long *)&pMVar9->field_0x10;
    lVar23 = **(long **)&pMVar9->field_0x48;
    for (; uVar19 = (ulong)pRVar13->start_pos, uVar19 != 0xffff; pRVar13 = pRVar13 + 1) {
      uVar2 = pRVar13->end_pos;
      uVar4 = puVar11[pRVar13->label];
      for (; uVar19 < uVar2; uVar19 = uVar19 + 1) {
        uVar22 = uVar19 >> 6 & 0x3ffffff;
        if ((puVar7[(long)(iVar17 * 2) + uVar22] >> (uVar19 & 0x3f) & 1) != 0) {
          *(uint *)(lVar23 * local_e8 + lVar18 + uVar19 * 4) = uVar4;
        }
        if ((puVar7[(long)(iVar17 * 2) + (long)iVar3 + uVar22] & 1L << ((byte)uVar19 & 0x3f)) != 0)
        {
          *(uint *)(lVar23 * lVar14 + lVar18 + uVar19 * 4) = uVar4;
        }
      }
    }
    pRVar13 = pRVar13 + 1;
    local_e8 = local_e8 + 2;
    lVar14 = lVar14 + 2;
  }
  if (iVar10 != 0) {
    lVar14 = **(long **)&pMVar9->field_0x48;
    lVar18 = *(long *)&pMVar9->field_0x10;
    for (; uVar12 = (ulong)pRVar13->start_pos, uVar12 != 0xffff; pRVar13 = pRVar13 + 1) {
      uVar2 = pRVar13->end_pos;
      uVar4 = puVar11[pRVar13->label];
      for (; uVar12 < uVar2; uVar12 = uVar12 + 1) {
        *(uint *)((_height + -1) * lVar14 + lVar18 + uVar12 * 4) = uVar4;
      }
    }
  }
  TTA::Dealloc();
  Runs::Dealloc(&this->data_runs);
  Data_Compressed::Dealloc(&this->data_flags);
  Data_Compressed::Dealloc(&this->data_merged);
  Data_Compressed::Dealloc(this_00);
  return;
}

Assistant:

void PerformLabeling()
    {
        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        data_merged.Alloc(h_merge, w);
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        data_flags.Alloc(h_merge - 1, w);
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        //find runs
        data_runs.Alloc(h_merge, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);

        img_labels_ = cv::Mat1i(img_.size(), 0);    // (0-init)

        // New version (uses 1-byte per pixel input)
        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (int j = start_pos; j < end_pos; j++) {
                    if (data_u[j >> 6] & (1ull << (j & 0x3F))) labels_u[j] = label;
                    if (data_d[j >> 6] & (1ull << (j & 0x3F))) labels_d[j] = label;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) {
                    labels[j] = label;
                }
            }
        }


        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_flags.Dealloc();
        data_merged.Dealloc();
        data_compressed.Dealloc();
    }